

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O3

void __thiscall catalog::LoadIM_RM(catalog *this,IndexManager *IM,RecordManager *RM)

{
  _Base_ptr p_Var1;
  TableInfo *pTVar2;
  int iVar3;
  _Base_ptr p_Var4;
  pointer ppTVar5;
  long lVar6;
  _Self __tmp;
  ulong uVar7;
  vector<IndexInfo,_std::allocator<IndexInfo>_> IndexList;
  vector<TableInfo,_std::allocator<TableInfo>_> TS;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_f8;
  RecordManager *local_e0;
  IndexManager *local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<TableInfo,_std::allocator<TableInfo>_> local_60;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_48;
  
  local_f8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_f8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  iVar3 = this->tableNumber;
  local_e0 = RM;
  local_d8 = IM;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      pTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar6];
      p_Var4 = *(_Base_ptr *)((long)&(pTVar2->indexInfo)._M_t._M_impl + 0x18);
      p_Var1 = (_Base_ptr)((long)&(pTVar2->indexInfo)._M_t._M_impl + 8);
      if (p_Var4 != p_Var1) {
        do {
          local_d0 = lVar6;
          _Stack_c0._M_p = (pointer)&local_b0;
          local_b8 = (pointer)0x0;
          local_b0._M_local_buf[0] = '\0';
          local_a0._M_p = (pointer)&local_90;
          local_98 = 0;
          local_90._M_local_buf[0] = '\0';
          local_80._M_p = (pointer)&local_70;
          local_78 = 0;
          local_70._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_assign((string *)&local_a0);
          std::__cxx11::string::_M_assign((string *)&_Stack_c0);
          local_c8._4_4_ =
               *(int *)(*(long *)&(pTVar2->type).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data +
                       (long)(int)p_Var4[1]._M_color * 4);
          std::vector<IndexInfo,_std::allocator<IndexInfo>_>::push_back
                    (&local_f8,(IndexInfo *)local_c8);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          IndexInfo::~IndexInfo((IndexInfo *)local_c8);
          lVar6 = local_d0;
        } while (p_Var4 != p_Var1);
        iVar3 = this->tableNumber;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::vector(&local_48,&local_f8);
  IndexManager::LoadAllBpTree(local_d8,&local_48);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_48);
  local_c8 = (undefined1  [8])0x0;
  _Stack_c0._M_p = (pointer)0x0;
  local_b8 = (pointer)0x0;
  ppTVar5 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar5) {
    uVar7 = 0;
    do {
      std::vector<TableInfo,_std::allocator<TableInfo>_>::push_back
                ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8,ppTVar5[uVar7]);
      uVar7 = uVar7 + 1;
      ppTVar5 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->TableInfoList).
                                   super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3));
  }
  std::vector<TableInfo,_std::allocator<TableInfo>_>::vector
            (&local_60,(vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  RecordManager::LoadAllRecordSet(local_e0,&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector(&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector
            ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_f8);
  return;
}

Assistant:

void catalog::LoadIM_RM(IndexManager& IM,RecordManager& RM){
    //load bptree record
    std::vector<IndexInfo> IndexList;
    for(int i = 0 ; i < tableNumber ; i ++){
        TableInfo* T = TableInfoList[i];
        auto it = T->indexInfo.begin();
        while(it!=T->indexInfo.end()){
            IndexInfo i;
            i.tableName = T->tableName;
            i.indexName = it->second;
            i.type = T->type[it->first];
            IndexList.push_back(i);
            it++;
        }
    }
    IM.LoadAllBpTree(IndexList);
    std::vector<TableInfo> TS;
    for(int i = 0 ; i < TableInfoList.size();i++){
        TS.push_back(*(TableInfoList[i]));
    }
    RM.LoadAllRecordSet(TS);
}